

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **arg)

{
  float fVar1;
  float fVar2;
  float fVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  ParameterObj par;
  pointer ppMVar7;
  ModelInstance *pMVar8;
  reference ppMVar9;
  vector<float,_std::allocator<float>_> *this;
  reference ppvVar10;
  reference pvVar11;
  pointer ppMVar12;
  reference pvVar13;
  int *piVar14;
  float *pfVar15;
  reference pvVar16;
  reference pvVar17;
  reference this_00;
  reference pvVar18;
  ostream *poVar19;
  long lVar20;
  size_t i_1;
  size_type sVar21;
  int i;
  int iVar22;
  value_type vVar23;
  float *pfVar24;
  NetworkArray *pNVar25;
  undefined1 *puVar26;
  int i_2;
  int i_5;
  bool bVar27;
  byte bVar28;
  float fVar29;
  float fVar30;
  IO myIO;
  allocator local_60d9;
  vector<ModelInstance_*,_std::allocator<ModelInstance_*>_> sims;
  vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> boundarr;
  string nickingmoment_file;
  vector<std::array<int,_36UL>,_std::allocator<std::array<int,_36UL>_>_> states_arr;
  vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> homotetramer_arr;
  vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> nicking_arr;
  string states_file;
  string singleState_file;
  string homotetramermoment_file;
  string homotetramer_file;
  string activemoment_file;
  string dimerbinding_file;
  string nicking_file;
  _Vector_base<std::array<int,_36UL>,_std::allocator<std::array<int,_36UL>_>_> local_5f48;
  _Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_> local_5f30;
  _Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> local_5f18;
  _Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_> local_5f00;
  _Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> local_5ee8;
  _Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> local_5ed0;
  _Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_> local_5eb8;
  ParameterObj myparameters;
  string local_5e88;
  string local_5e68;
  string local_5e48;
  string local_5e28;
  string local_5e08;
  string local_5de8;
  string local_5dc8;
  string local_5da8;
  ofstream out;
  undefined4 uStack_5d84;
  UniformDistribution unif;
  array<std::vector<float,_std::allocator<float>_>_*,_1000UL> arr_per_sim;
  NetworkArray network;
  
  bVar28 = 0;
  IO::read((IO *)&myparameters,(int)&myIO,(void *)(ulong)(uint)argc,(size_t)arg);
  par.L_conc = myparameters.L_conc;
  par.S_conc = myparameters.S_conc;
  par.top = myparameters.top;
  par.H_conc = myparameters.H_conc;
  par.subs = myparameters.subs;
  NetworkArray::NetworkArray(&network,par);
  sims.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sims.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sims.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar22 = 1000;
  while (bVar27 = iVar22 != 0, iVar22 = iVar22 + -1, bVar27) {
    pMVar8 = (ModelInstance *)operator_new(0x1578);
    pNVar25 = &network;
    puVar26 = &stack0xffffffffffff8a08;
    for (lVar20 = 0x14e4; lVar20 != 0; lVar20 = lVar20 + -1) {
      *puVar26 = *(undefined1 *)(pNVar25->transitions)._M_elems[0]._M_elems;
      pNVar25 = (NetworkArray *)((long)pNVar25 + (ulong)bVar28 * -2 + 1);
      puVar26 = puVar26 + (ulong)bVar28 * -2 + 1;
    }
    ModelInstance::ModelInstance(pMVar8);
    unif.super_Distribution._vptr_Distribution = (_func_int **)pMVar8;
    std::vector<ModelInstance*,std::allocator<ModelInstance*>>::emplace_back<ModelInstance*>
              ((vector<ModelInstance*,std::allocator<ModelInstance*>> *)&sims,
               (ModelInstance **)&unif);
  }
  ppMVar9 = std::vector<ModelInstance_*,_std::allocator<ModelInstance_*>_>::at(&sims,0);
  fVar1 = (*ppMVar9)->totaltime;
  ppMVar9 = std::vector<ModelInstance_*,_std::allocator<ModelInstance_*>_>::at(&sims,0);
  fVar2 = (*ppMVar9)->dt_react;
  ppMVar9 = std::vector<ModelInstance_*,_std::allocator<ModelInstance_*>_>::at(&sims,0);
  fVar3 = (*ppMVar9)->dt_diff;
  UniformDistribution::UniformDistribution(&unif,0.0,1.0);
  memset(&arr_per_sim,0,8000);
  for (lVar20 = 0; lVar20 != 8000; lVar20 = lVar20 + 8) {
    this = (vector<float,_std::allocator<float>_> *)operator_new(0x18);
    (this->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (this->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    (this->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    for (iVar22 = 0; (float)iVar22 < (2.0 / fVar3 + 1.0 / fVar2) * (fVar1 + 30.0);
        iVar22 = iVar22 + 1) {
      fVar29 = UniformDistribution::getRandomNumber(&unif);
      _out = CONCAT44(uStack_5d84,fVar29);
      std::vector<float,_std::allocator<float>_>::emplace_back<float>(this,(float *)&out);
    }
    *(vector<float,_std::allocator<float>_> **)((long)arr_per_sim._M_elems + lVar20) = this;
  }
  for (sVar21 = 0; sVar21 != 1000; sVar21 = sVar21 + 1) {
    ppMVar9 = std::vector<ModelInstance_*,_std::allocator<ModelInstance_*>_>::at(&sims,sVar21);
    pMVar8 = *ppMVar9;
    ppvVar10 = std::array<std::vector<float,_std::allocator<float>_>_*,_1000UL>::at
                         (&arr_per_sim,sVar21);
    ModelInstance::main(pMVar8,*ppvVar10);
  }
  _out = 0;
  std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::vector
            (&nicking_arr,3000,(value_type *)&out,(allocator_type *)&nickingmoment_file);
  ppMVar7 = sims.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppMVar12 = sims.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl
                  .super__Vector_impl_data._M_start; ppMVar12 != ppMVar7; ppMVar12 = ppMVar12 + 1) {
    pMVar8 = *ppMVar12;
    for (sVar21 = 0; sVar21 != 3000; sVar21 = sVar21 + 1) {
      fVar3 = pMVar8->nick1;
      fVar29 = pMVar8->nick2;
      fVar30 = (float)(int)sVar21 * 0.1;
      bVar27 = fVar3 <= 0.0;
      bVar4 = fVar30 <= fVar3;
      bVar5 = fVar29 <= 0.0;
      bVar6 = fVar30 <= fVar29;
      if ((bVar4 || bVar27) && (bVar6 || bVar5)) {
        pvVar11 = std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::at
                            (&nicking_arr,sVar21);
        pvVar11->_M_elems[0] = pvVar11->_M_elems[0] + 0.001;
      }
      if ((!bVar4 && !bVar27) && (bVar6 || bVar5)) {
        pvVar11 = std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::at
                            (&nicking_arr,sVar21);
        pvVar11->_M_elems[1] = pvVar11->_M_elems[1] + 0.001;
      }
      if ((bVar4 || bVar27) && (!bVar6 && !bVar5)) {
        pvVar11 = std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::at
                            (&nicking_arr,sVar21);
        pvVar11->_M_elems[2] = pvVar11->_M_elems[2] + 0.001;
      }
      if ((!bVar4 && !bVar27) && (!bVar6 && !bVar5)) {
        pvVar11 = std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::at
                            (&nicking_arr,sVar21);
        pvVar11->_M_elems[3] = pvVar11->_M_elems[3] + 0.001;
      }
    }
  }
  _out = 0;
  std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::vector
            (&boundarr,3000,(value_type *)&out,(allocator_type *)&nickingmoment_file);
  ppMVar7 = sims.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppMVar12 = sims.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl
                  .super__Vector_impl_data._M_start; ppMVar12 != ppMVar7; ppMVar12 = ppMVar12 + 1) {
    pMVar8 = *ppMVar12;
    pfVar24 = (pMVar8->dimersactive)._M_elems[0].super__Vector_base<float,_std::allocator<float>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pfVar15 = (pMVar8->dimersactive)._M_elems[1].super__Vector_base<float,_std::allocator<float>_>.
              _M_impl.super__Vector_impl_data._M_start;
    bVar4 = false;
    bVar27 = false;
    for (sVar21 = 0; sVar21 != 3000; sVar21 = sVar21 + 1) {
      iVar22 = (int)sVar21;
      if ((pfVar24 ==
           (pMVar8->dimersactive)._M_elems[0].super__Vector_base<float,_std::allocator<float>_>.
           _M_impl.super__Vector_impl_data._M_finish) || ((float)iVar22 * 0.1 < *pfVar24)) {
        if ((bVar27) &&
           (pMVar8->currenttime <= (float)iVar22 * 0.1 && (float)iVar22 * 0.1 != pMVar8->currenttime
           )) {
          bVar27 = false;
        }
      }
      else {
        bVar27 = (bool)(bVar27 ^ 1);
        pfVar24 = pfVar24 + 1;
      }
      if ((pfVar15 ==
           (pMVar8->dimersactive)._M_elems[1].super__Vector_base<float,_std::allocator<float>_>.
           _M_impl.super__Vector_impl_data._M_finish) || ((float)iVar22 * 0.1 < *pfVar15)) {
        if ((bVar4) &&
           (pMVar8->currenttime <= (float)iVar22 * 0.1 && (float)iVar22 * 0.1 != pMVar8->currenttime
           )) {
          bVar4 = false;
        }
      }
      else {
        bVar4 = (bool)(bVar4 ^ 1);
        pfVar15 = pfVar15 + 1;
      }
      if (bVar27) {
        if (bVar4) {
          pvVar13 = std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::at
                              (&boundarr,sVar21);
          piVar14 = pvVar13->_M_elems + 3;
        }
        else {
          pvVar13 = std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::at
                              (&boundarr,sVar21);
          piVar14 = pvVar13->_M_elems + 1;
        }
      }
      else if (bVar4) {
        pvVar13 = std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::at
                            (&boundarr,sVar21);
        piVar14 = pvVar13->_M_elems + 2;
      }
      else {
        piVar14 = std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::at
                            (&boundarr,sVar21)->_M_elems;
      }
      *piVar14 = *piVar14 + 1;
    }
  }
  _out = 0;
  std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::vector
            (&homotetramer_arr,3000,(value_type *)&out,(allocator_type *)&nickingmoment_file);
  ppMVar7 = sims.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppMVar12 = sims.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  do {
    if (ppMVar12 == ppMVar7) {
      memset(&out,0,0x90);
      std::vector<std::array<int,_36UL>,_std::allocator<std::array<int,_36UL>_>_>::vector
                (&states_arr,3000,(value_type *)&out,(allocator_type *)&nickingmoment_file);
      ppMVar7 = sims.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      for (ppMVar12 = sims.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>.
                      _M_impl.super__Vector_impl_data._M_start; ppMVar12 != ppMVar7;
          ppMVar12 = ppMVar12 + 1) {
        pMVar8 = *ppMVar12;
        vVar23 = 1;
        for (sVar21 = 0; sVar21 != 3000; sVar21 = sVar21 + 1) {
          if (0 < vVar23) {
            pvVar17 = std::vector<int,_std::allocator<int>_>::at
                                (&pMVar8->states,(long)(int)(((float)(int)sVar21 * 0.1) / fVar2));
            vVar23 = *pvVar17;
          }
          this_00 = std::vector<std::array<int,_36UL>,_std::allocator<std::array<int,_36UL>_>_>::at
                              (&states_arr,sVar21);
          pvVar18 = std::array<int,_36UL>::at(this_00,(long)vVar23);
          *pvVar18 = *pvVar18 + 1;
        }
      }
      std::ofstream::ofstream(&out);
      std::__cxx11::string::string
                ((string *)&nickingmoment_file,"nicking_moments.tsv",(allocator *)&nicking_file);
      std::ofstream::open((string *)&out,(_Ios_Openmode)&nickingmoment_file);
      poVar19 = (ostream *)std::ostream::operator<<((ostream *)&out,fVar1);
      std::operator<<(poVar19,"\t");
      poVar19 = std::ostream::_M_insert<double>(0.10000000149011612);
      poVar19 = std::operator<<(poVar19,"\t");
      poVar19 = (ostream *)std::ostream::operator<<(poVar19,1000);
      std::endl<char,std::char_traits<char>>(poVar19);
      std::ofstream::close();
      std::vector<ModelInstance_*,_std::allocator<ModelInstance_*>_>::vector
                ((vector<ModelInstance_*,_std::allocator<ModelInstance_*>_> *)&local_5eb8,&sims);
      std::__cxx11::string::string((string *)&local_5da8,(string *)&nickingmoment_file);
      IO::momentsNicking(&myIO,(vector<ModelInstance_*,_std::allocator<ModelInstance_*>_> *)
                               &local_5eb8,&local_5da8);
      std::__cxx11::string::~string((string *)&local_5da8);
      std::_Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>::~_Vector_base
                (&local_5eb8);
      std::__cxx11::string::string
                ((string *)&nicking_file,"nicking.tsv",(allocator *)&dimerbinding_file);
      std::ofstream::open((string *)&out,(_Ios_Openmode)&nicking_file);
      poVar19 = (ostream *)std::ostream::operator<<((ostream *)&out,fVar1);
      std::operator<<(poVar19,"\t");
      poVar19 = std::ostream::_M_insert<double>(0.10000000149011612);
      poVar19 = std::operator<<(poVar19,"\t");
      poVar19 = (ostream *)std::ostream::operator<<(poVar19,1000);
      std::endl<char,std::char_traits<char>>(poVar19);
      std::ofstream::close();
      std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::vector
                ((vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)
                 &local_5ed0,&nicking_arr);
      std::__cxx11::string::string((string *)&local_5dc8,(string *)&nicking_file);
      IO::writeNicking(&myIO,(vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                              *)&local_5ed0,&local_5dc8);
      std::__cxx11::string::~string((string *)&local_5dc8);
      std::_Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::
      ~_Vector_base(&local_5ed0);
      std::__cxx11::string::string
                ((string *)&dimerbinding_file,"dimerBinding.tsv",(allocator *)&activemoment_file);
      std::ofstream::open((string *)&out,(_Ios_Openmode)&dimerbinding_file);
      poVar19 = (ostream *)std::ostream::operator<<((ostream *)&out,fVar1);
      std::operator<<(poVar19,"\t");
      poVar19 = std::ostream::_M_insert<double>(0.10000000149011612);
      poVar19 = std::operator<<(poVar19,"\t");
      poVar19 = (ostream *)std::ostream::operator<<(poVar19,1000);
      std::endl<char,std::char_traits<char>>(poVar19);
      std::ofstream::close();
      std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::vector
                ((vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)&local_5ee8
                 ,&boundarr);
      std::__cxx11::string::string((string *)&local_5de8,(string *)&dimerbinding_file);
      IO::writeDimerActivating
                (&myIO,(vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)
                       &local_5ee8,&local_5de8);
      std::__cxx11::string::~string((string *)&local_5de8);
      std::_Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::~_Vector_base
                (&local_5ee8);
      std::__cxx11::string::string
                ((string *)&activemoment_file,"dimerBinding_moments.tsv",
                 (allocator *)&homotetramer_file);
      std::ofstream::open((string *)&out,(_Ios_Openmode)&activemoment_file);
      poVar19 = (ostream *)std::ostream::operator<<((ostream *)&out,fVar1);
      std::operator<<(poVar19,"\t");
      poVar19 = std::ostream::_M_insert<double>(0.10000000149011612);
      poVar19 = std::operator<<(poVar19,"\t");
      poVar19 = (ostream *)std::ostream::operator<<(poVar19,1000);
      std::endl<char,std::char_traits<char>>(poVar19);
      std::ofstream::close();
      std::vector<ModelInstance_*,_std::allocator<ModelInstance_*>_>::vector
                ((vector<ModelInstance_*,_std::allocator<ModelInstance_*>_> *)&local_5f00,&sims);
      std::__cxx11::string::string((string *)&local_5e08,(string *)&activemoment_file);
      IO::momentsActive(&myIO,(vector<ModelInstance_*,_std::allocator<ModelInstance_*>_> *)
                              &local_5f00,&local_5e08);
      std::__cxx11::string::~string((string *)&local_5e08);
      std::_Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>::~_Vector_base
                (&local_5f00);
      std::__cxx11::string::string
                ((string *)&homotetramer_file,"homotetramers.tsv",
                 (allocator *)&homotetramermoment_file);
      std::ofstream::open((string *)&out,(_Ios_Openmode)&homotetramer_file);
      poVar19 = (ostream *)std::ostream::operator<<((ostream *)&out,fVar1);
      std::operator<<(poVar19,"\t");
      poVar19 = std::ostream::_M_insert<double>(0.10000000149011612);
      poVar19 = std::operator<<(poVar19,"\t");
      poVar19 = (ostream *)std::ostream::operator<<(poVar19,1000);
      std::endl<char,std::char_traits<char>>(poVar19);
      std::ofstream::close();
      std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::vector
                ((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
                 &local_5f18,&homotetramer_arr);
      std::__cxx11::string::string((string *)&local_5e28,(string *)&homotetramer_file);
      IO::writeHomotetramers
                (&myIO,(vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
                       &local_5f18,&local_5e28);
      std::__cxx11::string::~string((string *)&local_5e28);
      std::_Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::
      ~_Vector_base(&local_5f18);
      std::__cxx11::string::string
                ((string *)&homotetramermoment_file,"homotetramers_moments.tsv",
                 (allocator *)&singleState_file);
      std::ofstream::open((string *)&out,(_Ios_Openmode)&homotetramermoment_file);
      poVar19 = (ostream *)std::ostream::operator<<((ostream *)&out,fVar1);
      std::operator<<(poVar19,"\t");
      poVar19 = std::ostream::_M_insert<double>(0.10000000149011612);
      poVar19 = std::operator<<(poVar19,"\t");
      poVar19 = (ostream *)std::ostream::operator<<(poVar19,1000);
      std::endl<char,std::char_traits<char>>(poVar19);
      std::ofstream::close();
      std::vector<ModelInstance_*,_std::allocator<ModelInstance_*>_>::vector
                ((vector<ModelInstance_*,_std::allocator<ModelInstance_*>_> *)&local_5f30,&sims);
      std::__cxx11::string::string((string *)&local_5e48,(string *)&homotetramermoment_file);
      IO::momentsHomotetramer
                (&myIO,(vector<ModelInstance_*,_std::allocator<ModelInstance_*>_> *)&local_5f30,
                 &local_5e48);
      std::__cxx11::string::~string((string *)&local_5e48);
      std::_Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>::~_Vector_base
                (&local_5f30);
      std::__cxx11::string::string
                ((string *)&singleState_file,"statesSingle.tsv",(allocator *)&states_file);
      std::ofstream::open((string *)&out,(_Ios_Openmode)&singleState_file);
      std::ofstream::close();
      ppMVar9 = std::vector<ModelInstance_*,_std::allocator<ModelInstance_*>_>::at(&sims,0);
      pMVar8 = *ppMVar9;
      std::__cxx11::string::string((string *)&local_5e68,(string *)&singleState_file);
      IO::singleStates(&myIO,pMVar8,&local_5e68);
      std::__cxx11::string::~string((string *)&local_5e68);
      std::__cxx11::string::string((string *)&states_file,"states.tsv",&local_60d9);
      std::ofstream::open((string *)&out,(_Ios_Openmode)&states_file);
      poVar19 = (ostream *)std::ostream::operator<<((ostream *)&out,fVar1);
      std::operator<<(poVar19,"\t");
      poVar19 = std::ostream::_M_insert<double>(0.10000000149011612);
      poVar19 = std::operator<<(poVar19,"\t");
      poVar19 = (ostream *)std::ostream::operator<<(poVar19,1000);
      std::endl<char,std::char_traits<char>>(poVar19);
      std::ofstream::close();
      std::vector<std::array<int,_36UL>,_std::allocator<std::array<int,_36UL>_>_>::vector
                ((vector<std::array<int,_36UL>,_std::allocator<std::array<int,_36UL>_>_> *)
                 &local_5f48,&states_arr);
      std::__cxx11::string::string((string *)&local_5e88,(string *)&states_file);
      IO::writeStates(&myIO,(vector<std::array<int,_36UL>,_std::allocator<std::array<int,_36UL>_>_>
                             *)&local_5f48,&local_5e88);
      std::__cxx11::string::~string((string *)&local_5e88);
      std::_Vector_base<std::array<int,_36UL>,_std::allocator<std::array<int,_36UL>_>_>::
      ~_Vector_base(&local_5f48);
      poVar19 = std::operator<<((ostream *)&std::cout,"finished");
      std::endl<char,std::char_traits<char>>(poVar19);
      std::__cxx11::string::~string((string *)&states_file);
      std::__cxx11::string::~string((string *)&singleState_file);
      std::__cxx11::string::~string((string *)&homotetramermoment_file);
      std::__cxx11::string::~string((string *)&homotetramer_file);
      std::__cxx11::string::~string((string *)&activemoment_file);
      std::__cxx11::string::~string((string *)&dimerbinding_file);
      std::__cxx11::string::~string((string *)&nicking_file);
      std::__cxx11::string::~string((string *)&nickingmoment_file);
      std::ofstream::~ofstream(&out);
      std::_Vector_base<std::array<int,_36UL>,_std::allocator<std::array<int,_36UL>_>_>::
      ~_Vector_base(&states_arr.
                     super__Vector_base<std::array<int,_36UL>,_std::allocator<std::array<int,_36UL>_>_>
                   );
      std::_Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::
      ~_Vector_base(&homotetramer_arr.
                     super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                   );
      std::_Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::~_Vector_base
                (&boundarr.
                  super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>);
      std::_Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::
      ~_Vector_base(&nicking_arr.
                     super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                   );
      Distribution::~Distribution(&unif.super_Distribution);
      std::_Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>::~_Vector_base
                (&sims.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>);
      return 0;
    }
    pMVar8 = *ppMVar12;
    pfVar24 = (pMVar8->homotetramer).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start;
    bVar27 = false;
    for (sVar21 = 0; sVar21 != 3000; sVar21 = sVar21 + 1) {
      if ((pfVar24 ==
           (pMVar8->homotetramer).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish) || ((float)(int)sVar21 * 0.1 < *pfVar24)) {
        if (bVar27) goto LAB_00102ab4;
LAB_00102acc:
        if ((float)(int)sVar21 * 0.1 <= pMVar8->currenttime) {
          pvVar16 = std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::
                    at(&homotetramer_arr,sVar21);
          pfVar15 = pvVar16->_M_elems + 1;
          bVar27 = false;
          goto LAB_00102afc;
        }
        bVar27 = false;
      }
      else {
        pfVar24 = pfVar24 + 1;
        if (bVar27) goto LAB_00102acc;
LAB_00102ab4:
        pfVar15 = std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::at
                            (&homotetramer_arr,sVar21)->_M_elems;
        bVar27 = true;
LAB_00102afc:
        *pfVar15 = *pfVar15 + 1.0;
      }
    }
    ppMVar12 = ppMVar12 + 1;
  } while( true );
}

Assistant:

int main(int argc, char ** arg) {
	IO myIO;
	ParameterObj myparameters = myIO.read(argc, arg);

	NetworkArray network(myparameters);		// Set up the network
	const int num_sims = 1000;

	std::vector<ModelInstance*> sims; // create vector of pointers to model objects
	for (int i=0; i<num_sims; i++){
		sims.push_back(new ModelInstance(network, myparameters));
	}

	float totaltime = sims.at(0)->totaltime;
	float dt_reaction = sims.at(0)->dt_react;
	float dt_diffusion = sims.at(0)->dt_diff;
	float dt_plot = 0.1;

	UniformDistribution unif(0,1);
	std::array<std::vector<float>*, num_sims> arr_per_sim{};
	for (auto & it : arr_per_sim) {
		auto *myarr_ptr = new std::vector<float>;
		for (int i = 0; i < (totaltime+30.0)*(1/dt_reaction + 2/dt_diffusion); i++) {
			myarr_ptr->push_back(unif.getRandomNumber());
		}
		it = myarr_ptr;
	}

#pragma omp parallel
	{
#pragma omp for
		for (size_t i = 0; i < num_sims; i++){
			sims.at(i)->main(arr_per_sim.at(i));
		}
	}

	const int numtimesteps = 3000;
	std::vector<std::array<float, 4>> nicking_arr(numtimesteps, std::array<float, 4>{});
	bool nicked1;
	bool nicked2;

	// Create table nicking fractions over time
	for (ModelInstance* model: sims){
		for (int i = 0; i< numtimesteps; i++) {
			nicked1 = model->nick1 >0 && model->nick1 < i*dt_plot;
			nicked2 = model->nick2 >0 && model->nick2 < i*dt_plot;
			if (!nicked1 && !nicked2){
				nicking_arr.at(i).at(0) += 1.0 / num_sims;
			}
			if (nicked1 && !nicked2){
				nicking_arr.at(i).at(1) += 1.0 / num_sims;
			}
			if (!nicked1 && nicked2){
				nicking_arr.at(i).at(2) += 1.0 / num_sims;
			}
			if (nicked1 && nicked2){
				nicking_arr.at(i).at(3) += 1.0 / num_sims;
			}
		}
	}

	// Create table activations over time
	bool first_bound;
	bool second_bound;
	std::vector<std::array<int, 4>> boundarr(numtimesteps, std::array<int, 4>{});
	for (ModelInstance* model: sims){
		first_bound = false;
		second_bound = false;
		auto it1 = model->dimersactive.at(0).begin();
		auto it2 = model->dimersactive.at(1).begin();
		for (int i = 0; i< numtimesteps; i++) {
			if (it1 != model->dimersactive.at(0).end() && *it1 <= i * dt_plot){
				first_bound = !first_bound;
				it1++;
			}
			else if(first_bound && model->currenttime < i * dt_plot){
				first_bound = false;
			}
			if (it2 != model->dimersactive.at(1).end() && *it2 <= i * dt_plot){
				second_bound = !second_bound;
				it2++;
			}
			else if(second_bound && model->currenttime < i * dt_plot){
				second_bound = false;
			}
			if (!first_bound && !second_bound){
				boundarr.at(i).at(0) += 1;
			}
			if (first_bound && !second_bound){
				boundarr.at(i).at(1) += 1;
			}
			if (!first_bound && second_bound){
				boundarr.at(i).at(2) += 1;
			}
			if (first_bound && second_bound){
				boundarr.at(i).at(3) += 1;
			}
		}
	}

	// Create table homo/heterodimers over time
	bool ishomotetramer;
	std::vector<std::array<float,2>> homotetramer_arr(numtimesteps, std::array<float, 2>{});
	for(ModelInstance * model: sims){
		ishomotetramer = false;
		auto it1 = model->homotetramer.begin();
		for (int i = 0; i< numtimesteps; i++) {
			if (it1 != model->homotetramer.end() && *it1 <= i * dt_plot){
				ishomotetramer = !ishomotetramer;
				it1++;
			}
			if(ishomotetramer){
				homotetramer_arr.at(i).at(0) += 1;
			}
			else if(model->currenttime >= i * dt_plot){
				homotetramer_arr.at(i).at(1) += 1;
			}
		}
	}

	// Create table states over tine
	std::vector<std::array<int, 36>> states_arr(numtimesteps, std::array<int, 36>{});
	int index_statesvector;
	int currentstate;
	for (ModelInstance * model: sims) {
		currentstate = 1;
		for (int i=0; i<numtimesteps; i++){
			index_statesvector = float(i)*dt_plot/dt_reaction;
			if (currentstate > 0) {
				currentstate = model->states.at(index_statesvector);
			}
			states_arr.at(i).at(currentstate) += 1;
		}
	}

	std::ofstream out;

	// Save nicking moments
	std::string nickingmoment_file = "nicking_moments.tsv";
	out.open(nickingmoment_file);
	out << totaltime << "\t" << dt_plot << "\t" << num_sims << std::endl;
	out.close();
	myIO.momentsNicking(sims, nickingmoment_file);

	// Save nicking fractions over time
	std::string nicking_file = "nicking.tsv";
	out.open(nicking_file);
	out << totaltime << "\t" << dt_plot << "\t" << num_sims << std::endl;
	out.close();
	myIO.writeNicking(nicking_arr, nicking_file);

	// Save active dimers over time
	std::string dimerbinding_file = "dimerBinding.tsv";
	out.open(dimerbinding_file);
	out << totaltime << "\t" << dt_plot << "\t" << num_sims << std::endl;
	out.close();
	myIO.writeDimerActivating(boundarr, dimerbinding_file);

	// Save binding/unbinding moments
	std::string activemoment_file = "dimerBinding_moments.tsv";
	out.open(activemoment_file);
	out << totaltime << "\t" << dt_plot << "\t" << num_sims << std::endl;
	out.close();
	myIO.momentsActive(sims, activemoment_file);

	// Save homo/heterotetramers over time
	std::string homotetramer_file = "homotetramers.tsv";
	out.open(homotetramer_file);
	out << totaltime << "\t" << dt_plot << "\t" << num_sims << std::endl;
	out.close();
	myIO.writeHomotetramers(homotetramer_arr, homotetramer_file);

	// Save homotetramer moments
	std::string homotetramermoment_file = "homotetramers_moments.tsv";
	out.open(homotetramermoment_file);
	out << totaltime << "\t" << dt_plot << "\t" << num_sims << std::endl;
	out.close();
	myIO.momentsHomotetramer(sims, homotetramermoment_file);

	std::string singleState_file = "statesSingle.tsv";
	out.open(singleState_file);
	out.close();
	myIO.singleStates(sims.at(0), singleState_file);

	std::string states_file = "states.tsv";
	out.open(states_file);
	out << totaltime << "\t" << dt_plot << "\t" << num_sims << std::endl;
	out.close();
	myIO.writeStates(states_arr, states_file);

	std::cout << "finished" << std::endl;
	return 0;
}